

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O0

void float_conversion(uchar *value,int size,FMfloat_format src_format,FMfloat_format dest_format)

{
  undefined4 uVar1;
  int iVar2;
  FMfloat_format in_ECX;
  FMfloat_format in_EDX;
  int in_ESI;
  char *in_RDI;
  int tmp;
  
  if (in_EDX == in_ECX) {
    return;
  }
  if (in_EDX == fm_reverse_float_formats[in_ECX]) {
    byte_swap(in_RDI,in_ESI);
    return;
  }
  iVar2 = in_EDX * 0x10000 + in_ECX;
  if (iVar2 == 0x10003) {
LAB_00137dee:
    byte_swap(in_RDI,4);
    byte_swap(in_RDI + 4,4);
  }
  else {
    if (iVar2 != 0x20003) {
      if (iVar2 == 0x30001) goto LAB_00137dee;
      if (iVar2 != 0x30002) {
        printf("unanticipated float conversion \n");
        return;
      }
    }
    uVar1 = *(undefined4 *)in_RDI;
    *(undefined4 *)in_RDI = *(undefined4 *)(in_RDI + 4);
    *(undefined4 *)(in_RDI + 4) = uVar1;
  }
  return;
}

Assistant:

static void
float_conversion(unsigned char*value, int size, FMfloat_format src_format,
		 FMfloat_format dest_format)
{
    int tmp;
    if (src_format == dest_format) return;
    if (src_format == fm_reverse_float_formats[dest_format]) {
	byte_swap((char *) value, size);
	return;
    }
    switch (CONV(src_format, dest_format)) {
    case CONV(Format_IEEE_754_bigendian, Format_IEEE_754_mixedendian):
    case CONV(Format_IEEE_754_mixedendian, Format_IEEE_754_bigendian):
	byte_swap((char*)&value[0], 4);
	byte_swap((char*)&value[4], 4);
	break;
    case CONV(Format_IEEE_754_littleendian, Format_IEEE_754_mixedendian):
    case CONV(Format_IEEE_754_mixedendian, Format_IEEE_754_littleendian):
	tmp = *(int*)&value[0];
	*(int*)&value[0] = *(int*)&value[4];
	*(int*)&value[4] = tmp;
	break;
    default:
	printf("unanticipated float conversion \n");
    }
}